

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

void __thiscall CStructure::CopyLabel(CStructure *this,char *nnaam,aint offset)

{
  CStructureEntry1 *this_00;
  CStructureEntry1 **ppCVar1;
  
  this_00 = (CStructureEntry1 *)operator_new(0x18);
  CStructureEntry1::CStructureEntry1(this_00,nnaam,offset + this->noffset);
  ppCVar1 = &this->mnl->next;
  if (this->mnf == (CStructureEntry1 *)0x0) {
    ppCVar1 = &this->mnf;
  }
  *ppCVar1 = this_00;
  this->mnl = this_00;
  return;
}

Assistant:

void CStructure::CopyLabel(char* nnaam, aint offset) {
	CStructureEntry1* n = new CStructureEntry1(nnaam, noffset + offset);
	if (!mnf)	mnf = n;
	else		mnl->next = n;
	mnl = n;
}